

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basicTests.cpp
# Opt level: O2

void __thiscall
TEST_ClassName_stdOutMessesWithOutputAndFails_Test::testBody
          (TEST_ClassName_stdOutMessesWithOutputAndFails_Test *this)

{
  UtestShell *pUVar1;
  char *pcVar2;
  char *pcVar3;
  TestTerminator *pTVar4;
  SimpleString SStack_38;
  SimpleString local_28;
  
  printf("This will appear in the output");
  pUVar1 = UtestShell::getCurrent();
  StringFrom((int)&local_28);
  pcVar2 = SimpleString::asCharString(&local_28);
  StringFrom((int)&SStack_38);
  pcVar3 = SimpleString::asCharString(&SStack_38);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[0x16])
            (pUVar1,1,pcVar2,pcVar3,0,
             "/workspace/llm4binary/github/license_c_cmakelists/bneumann[P]CppUTest-Test-Adapter/test/basicTests.cpp"
             ,0x41,pTVar4);
  SimpleString::~SimpleString(&SStack_38);
  SimpleString::~SimpleString(&local_28);
  return;
}

Assistant:

TEST(ClassName, stdOutMessesWithOutputAndFails)
{
  printf("This will appear in the output");
  int out = 24 + 74;
  CHECK_EQUAL(17, out);
}